

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O3

void DepParserTask::get_gold_actions
               (search *sch,uint32_t idx,uint64_t param_3,v_array<unsigned_int> *gold_actions)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint local_34;
  
  pvVar3 = sch->task_data;
  v_array<unsigned_int>::clear(gold_actions);
  lVar9 = *(long *)((long)pvVar3 + 0xa0);
  if (lVar9 == *(long *)((long)pvVar3 + 0x98)) {
    uVar11 = 0;
  }
  else {
    uVar11 = (ulong)*(uint *)(lVar9 + -4);
  }
  if (*(int *)((long)pvVar3 + 0x2c4) != 1) goto LAB_00271f48;
  piVar4 = *(int **)((long)pvVar3 + 0x18);
  lVar6 = (long)*(int **)((long)pvVar3 + 0x20) - (long)piVar4;
  if (lVar6 == 0) goto LAB_00271f48;
  uVar7 = lVar6 >> 2;
  if (*piVar4 == 1) {
LAB_00271ed7:
    if ((lVar9 == *(long *)((long)pvVar3 + 0x98)) ||
       ((int)uVar11 == *(int *)(*(long *)((long)pvVar3 + 0x58) + (ulong)idx * 4))) {
      puVar8 = &SHIFT;
      goto LAB_00271eee;
    }
  }
  else {
    uVar5 = 1;
    do {
      uVar10 = uVar5;
      if (uVar7 + (uVar7 == 0) == uVar10) break;
      uVar5 = uVar10 + 1;
    } while (piVar4[uVar10] != 1);
    if (uVar10 < uVar7) goto LAB_00271ed7;
  }
  if (*(int **)((long)pvVar3 + 0x20) != piVar4) {
    if (*piVar4 != 3) {
      uVar5 = 1;
      do {
        uVar10 = uVar5;
        if (uVar7 + (uVar7 == 0) == uVar10) break;
        uVar5 = uVar10 + 1;
      } while (piVar4[uVar10] != 3);
      if (uVar7 <= uVar10) goto LAB_00271f48;
    }
    if (*(uint32_t *)(*(long *)((long)pvVar3 + 0x58) + uVar11 * 4) == idx) {
      puVar8 = &REDUCE_LEFT;
LAB_00271eee:
      v_array<unsigned_int>::push_back(gold_actions,puVar8);
      return;
    }
  }
LAB_00271f48:
  local_34 = 1;
  uVar11 = 1;
  do {
    if ((local_34 != 4) || (*(int *)((long)pvVar3 + 0x2c4) != 1)) {
      uVar1 = *(uint *)(*(long *)((long)pvVar3 + 0x38) + (ulong)local_34 * 4);
      uVar2 = *(uint *)(*(long *)((long)pvVar3 + 0x38) + uVar11 * 4);
      if (uVar1 < uVar2) {
        puVar8 = *(uint **)((long)pvVar3 + 0x18);
        lVar9 = *(long *)((long)pvVar3 + 0x20) - (long)puVar8;
        if (lVar9 == 0) goto LAB_00271fcf;
        uVar7 = lVar9 >> 2;
        if (*puVar8 != local_34) {
          uVar5 = 1;
          do {
            uVar10 = uVar5;
            if (uVar7 + (uVar7 == 0) == uVar10) break;
            uVar5 = uVar10 + 1;
          } while (puVar8[uVar10] != local_34);
          if (uVar7 <= uVar10) goto LAB_00271fcf;
        }
        v_array<unsigned_int>::clear(gold_actions);
        uVar11 = (ulong)local_34;
        goto LAB_0027200f;
      }
LAB_00271fcf:
      if (uVar1 == uVar2) {
        puVar8 = *(uint **)((long)pvVar3 + 0x18);
        lVar9 = *(long *)((long)pvVar3 + 0x20) - (long)puVar8;
        if (lVar9 != 0) {
          uVar7 = lVar9 >> 2;
          if (*puVar8 != local_34) {
            uVar5 = 1;
            do {
              uVar10 = uVar5;
              if (uVar7 + (uVar7 == 0) == uVar10) break;
              uVar5 = uVar10 + 1;
            } while (puVar8[uVar10] != local_34);
            if (uVar7 <= uVar10) goto LAB_0027201a;
          }
LAB_0027200f:
          v_array<unsigned_int>::push_back(gold_actions,&local_34);
        }
      }
    }
LAB_0027201a:
    local_34 = local_34 + 1;
    if (4 < local_34) {
      return;
    }
  } while( true );
}

Assistant:

void get_gold_actions(Search::search &sch, uint32_t idx, uint64_t /* n */, v_array<action> &gold_actions)
{
  task_data *data = sch.get_task_data<task_data>();
  v_array<uint32_t> &action_loss = data->action_loss, &stack = data->stack, &gold_heads = data->gold_heads,
                    &valid_actions = data->valid_actions;
  gold_actions.clear();
  size_t size = stack.size();
  size_t last = (size == 0) ? 0 : stack.last();
  uint32_t &sys = data->transition_system;

  if (sys == arc_hybrid && is_valid(SHIFT, valid_actions) && (stack.empty() || gold_heads[idx] == last))
  {
    gold_actions.push_back(SHIFT);
    return;
  }

  if (sys == arc_hybrid && is_valid(REDUCE_LEFT, valid_actions) && gold_heads[last] == idx)
  {
    gold_actions.push_back(REDUCE_LEFT);
    return;
  }
  size_t best_action = 1;
  size_t count = 0;
  for (uint32_t i = 1; i <= 4; i++)
  {
    if (i == 4 && sys == arc_hybrid)
      continue;
    if (action_loss[i] < action_loss[best_action] && is_valid(i, valid_actions))
    {
      best_action = i;
      count = 1;
      gold_actions.clear();
      gold_actions.push_back(i);
    }
    else if (action_loss[i] == action_loss[best_action] && is_valid(i, valid_actions))
    {
      count++;
      gold_actions.push_back(i);
    }
  }
}